

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall branch_and_reduce_algorithm::dfs_root(branch_and_reduce_algorithm *this,int v)

{
  int v_00;
  pointer pvVar1;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  
  iVar6 = this->current_dfs_num;
  (this->minNr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[v] = iVar6;
  this->current_dfs_num = iVar6 + 1;
  piVar4 = (this->visited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4[v] = iVar6;
  pvVar1 = (this->adj).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = pvVar1[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = *(pointer *)
            ((long)&pvVar1[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar7 != piVar2) {
    iVar6 = 0;
    do {
      v_00 = *piVar7;
      if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[v_00] < 0) && (piVar4[v_00] < 0)) {
        iVar6 = iVar6 + 1;
        dfs(this,v_00,v);
        piVar3 = (this->minNr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = piVar3[v];
        if (piVar3[v_00] < piVar3[v]) {
          iVar5 = piVar3[v_00];
        }
        piVar3[v] = iVar5;
        piVar4 = (this->visited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar4[v] <= piVar3[v_00]) {
          (this->articulation_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[v] = 1;
        }
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
    if (1 < iVar6) {
      return;
    }
  }
  (this->articulation_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[v] = 0;
  return;
}

Assistant:

void branch_and_reduce_algorithm::dfs_root(int v)
{
    minNr[v] = current_dfs_num;
    visited[v] = current_dfs_num++;

    int direct_children = 0;

    for (int u : adj[v])
    {
        if (x[u] < 0 && visited[u] < 0) // tree edge
        {
            direct_children++;

            dfs(u, v);
            minNr[v] = min(minNr[v], minNr[u]);

            if (minNr[u] >= visited[v]) // cut vertex found
                articulation_points[v] = 1;
        }
        // else if (x[u] < 0) // backwards edge
        //     minNr[v] = min(minNr[v], visited[u]);
    }

    if (direct_children < 2) // root is no cut vertex
        articulation_points[v] = 0;
}